

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O3

Vec_Wrd_t * Abc_NtkShareSuperAnd(Abc_Obj_t *pObj,int *pCounter)

{
  ulong *puVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  ulong uVar4;
  Vec_Ptr_t *pVVar5;
  uint uVar6;
  Vec_Wrd_t *p;
  word *pwVar7;
  ulong uVar8;
  ulong uVar9;
  word wVar10;
  long *plVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                  ,0xa6,"Vec_Wrd_t *Abc_NtkShareSuperAnd(Abc_Obj_t *, int *)");
  }
  pAVar3 = pObj->pNtk;
  p = (Vec_Wrd_t *)malloc(0x10);
  p->nCap = 0x10;
  p->nSize = 0;
  pwVar7 = (word *)malloc(0x80);
  p->pArray = pwVar7;
  if (pObj->Id < 0) {
LAB_002c4a15:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  Vec_WrdPush(p,(ulong)(*(uint *)&pObj->field_0x14 >> 0xc) << 0x20 | (ulong)(uint)pObj->Id * 2);
  uVar6 = p->nSize;
  if ((int)uVar6 < 1) {
    return p;
  }
LAB_002c46b4:
  pwVar7 = p->pArray;
  uVar8 = (ulong)uVar6;
  if (1 < uVar6) {
    uVar9 = 1;
    wVar10 = *pwVar7;
    do {
      puVar1 = pwVar7 + uVar9;
      if (*puVar1 <= wVar10) {
        __assert_fail("Num < NumNext",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                      ,0xb0,"Vec_Wrd_t *Abc_NtkShareSuperAnd(Abc_Obj_t *, int *)");
      }
      uVar9 = uVar9 + 1;
      wVar10 = *puVar1;
    } while (uVar8 != uVar9);
  }
  uVar13 = 1;
  if ((int)uVar6 < 1) {
    uVar13 = uVar6;
  }
  uVar14 = uVar6;
  uVar9 = uVar8;
  do {
    uVar9 = uVar9 - 1;
    if (uVar6 <= uVar14 - 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
    }
    uVar4 = pwVar7[uVar9 & 0xffffffff];
    if ((int)(uint)uVar4 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    uVar15 = uVar4 >> 1 & 0x7fffffff;
    pVVar5 = pAVar3->vObjs;
    if (pVVar5->nSize <= (int)uVar15) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    plVar11 = (long *)((ulong)((uint)uVar4 & 1) ^ (ulong)pVVar5->pArray[uVar15]);
    if ((((ulong)plVar11 & 1) == 0) && ((*(uint *)((long)plVar11 + 0x14) & 0xf) == 7)) {
      uVar15 = (ulong)(uVar6 - 1);
      uVar9 = 1;
      goto LAB_002c4767;
    }
    bVar16 = 1 < (int)uVar14;
    uVar14 = uVar14 - 1;
  } while (bVar16);
  uVar15 = (ulong)uVar6;
  uVar14 = uVar13 - 1;
  goto LAB_002c47a0;
LAB_002c4767:
  if (pwVar7[uVar9 - 1] != uVar4) goto code_r0x002c476e;
  if ((int)uVar9 < (int)uVar6) {
    uVar9 = uVar9 - 1;
    do {
      pwVar7[uVar9] = pwVar7[uVar9 + 1];
      uVar9 = uVar9 + 1;
    } while (uVar15 != uVar9);
  }
  p->nSize = uVar6 - 1;
  goto LAB_002c47a0;
code_r0x002c476e:
  bVar16 = uVar9 == uVar8;
  uVar9 = uVar9 + 1;
  if (bVar16) goto code_r0x002c477e;
  goto LAB_002c4767;
code_r0x002c477e:
  uVar15 = (ulong)uVar6;
LAB_002c47a0:
  if (uVar14 == 0) {
    if ((int)uVar15 < 1) {
      return p;
    }
    pwVar7 = p->pArray;
    uVar8 = 0;
    do {
      pwVar7[uVar8] = (long)(int)pwVar7[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar15 != uVar8);
    return p;
  }
  uVar6 = *(uint *)((long)plVar11 + 0x14);
  if ((uVar6 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                  ,0xbf,"Vec_Wrd_t *Abc_NtkShareSuperAnd(Abc_Obj_t *, int *)");
  }
  lVar12 = *(long *)(*(long *)(*plVar11 + 0x20) + 8);
  uVar8 = *(ulong *)(lVar12 + (long)*(int *)plVar11[4] * 8);
  uVar9 = uVar8 & 0xfffffffffffffffe;
  uVar13 = *(uint *)(uVar9 + 0x14);
  uVar14 = uVar13 & 0xf;
  if ((7 < uVar14) || ((0xa4U >> uVar14 & 1) == 0)) {
    __assert_fail("Abc_ObjIsNode(Abc_ObjRegular(pObj0)) || Abc_ObjIsCi(Abc_ObjRegular(pObj0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                  ,0xc3,"Vec_Wrd_t *Abc_NtkShareSuperAnd(Abc_Obj_t *, int *)");
  }
  uVar4 = *(ulong *)(lVar12 + (long)((int *)plVar11[4])[1] * 8);
  uVar15 = uVar4 & 0xfffffffffffffffe;
  uVar14 = *(uint *)(uVar15 + 0x14) & 0xf;
  if ((7 < uVar14) || ((0xa4U >> uVar14 & 1) == 0)) {
    __assert_fail("Abc_ObjIsNode(Abc_ObjRegular(pObj1)) || Abc_ObjIsCi(Abc_ObjRegular(pObj1))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                  ,0xc4,"Vec_Wrd_t *Abc_NtkShareSuperAnd(Abc_Obj_t *, int *)");
  }
  iVar2 = *(int *)(uVar9 + 0x10);
  if (iVar2 < 0) goto LAB_002c4a15;
  Vec_WrdPushOrder(p,CONCAT44(uVar13 >> 0xc,(((uint)uVar8 ^ uVar6 >> 10) & 1) + iVar2 * 2));
  if (*(int *)(uVar15 + 0x10) < 0) goto LAB_002c4a15;
  Vec_WrdPushOrder(p,CONCAT44(*(uint *)(uVar15 + 0x14) >> 0xc,
                              (((uint)uVar4 ^ uVar6 >> 0xb) & 1) + *(int *)(uVar15 + 0x10) * 2));
  *pCounter = *pCounter + 1;
  uVar13 = p->nSize;
  if ((long)(int)uVar13 < 1) {
    if (-1 < (int)uVar13) {
LAB_002c4942:
      p->nSize = 0;
      return p;
    }
LAB_002c4a53:
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                  ,0x276,"void Vec_WrdShrink(Vec_Wrd_t *, int)");
  }
  pwVar7 = p->pArray;
  wVar10 = *pwVar7;
  uVar6 = 0;
  if (uVar13 != 1) {
    uVar6 = 0;
    lVar12 = 1;
    do {
      uVar8 = pwVar7[lVar12];
      if (uVar8 < wVar10) {
        __assert_fail("Num <= NumNext",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                      ,0xd2,"Vec_Wrd_t *Abc_NtkShareSuperAnd(Abc_Obj_t *, int *)");
      }
      if ((wVar10 + 1 == uVar8) && ((uVar8 & 1) != 0)) goto LAB_002c4942;
      if (wVar10 < uVar8) {
        if (((int)uVar6 < 0) || (uVar13 <= uVar6)) goto LAB_002c49f6;
        uVar8 = (ulong)uVar6;
        uVar6 = uVar6 + 1;
        pwVar7[uVar8] = wVar10;
      }
      wVar10 = pwVar7[lVar12];
      lVar12 = lVar12 + 1;
    } while ((int)uVar13 != lVar12);
  }
  if (((int)uVar6 < 0) || (uVar13 <= uVar6)) {
LAB_002c49f6:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                  ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
  }
  pwVar7[uVar6] = wVar10;
  if ((int)uVar13 <= (int)uVar6) goto LAB_002c4a53;
  uVar6 = uVar6 + 1;
  p->nSize = uVar6;
  goto LAB_002c46b4;
}

Assistant:

Vec_Wrd_t * Abc_NtkShareSuperAnd( Abc_Obj_t * pObj, int * pCounter )
{
    Abc_Ntk_t * pNtk = Abc_ObjNtk(pObj);
    Abc_Obj_t * pObj0, * pObj1, * pRoot = NULL;
    Vec_Wrd_t * vSuper;
    word Num, NumNext;
    int i, k;
    assert( !Abc_ObjIsComplement(pObj) );
    // start iteration
    vSuper = Vec_WrdAlloc( 10 );
    Vec_WrdPush( vSuper, Abc_NtkSharePack(Abc_ObjLevel(pObj), Abc_ObjToLit(pObj)) );
    while ( Vec_WrdSize(vSuper) > 0 )
    {
        // make sure there are no duplicates
        Num = Vec_WrdEntry( vSuper, 0 );
        Vec_WrdForEachEntryStart( vSuper, NumNext, i, 1 )
        {
            assert( Num < NumNext );
            Num = NumNext;
        }
        // extract AND gate decomposable on the topmost level
        Vec_WrdForEachEntryReverse( vSuper, Num, i )
        {
            pRoot = Abc_ObjFromLit( pNtk, Abc_NtkShareUnpackId(Num) );
            if ( !Abc_ObjIsComplement(pRoot) && Abc_ObjIsNode(pRoot) )
            {
                Vec_WrdRemove( vSuper, Num );
                break;
            }
        }
        if ( i == -1 )
            break;
        assert( Abc_ObjIsNode(pRoot) );
        // extract
        pObj0 = Abc_ObjChild0(pRoot);
        pObj1 = Abc_ObjChild1(pRoot);
        assert( Abc_ObjIsNode(Abc_ObjRegular(pObj0)) || Abc_ObjIsCi(Abc_ObjRegular(pObj0)) );
        assert( Abc_ObjIsNode(Abc_ObjRegular(pObj1)) || Abc_ObjIsCi(Abc_ObjRegular(pObj1)) );
        Vec_WrdPushOrder( vSuper, Abc_NtkSharePack(Abc_ObjLevel(Abc_ObjRegular(pObj0)), Abc_ObjToLit(pObj0)) );
        Vec_WrdPushOrder( vSuper, Abc_NtkSharePack(Abc_ObjLevel(Abc_ObjRegular(pObj1)), Abc_ObjToLit(pObj1)) );
        (*pCounter)++;
        // remove duplicates
        k = 0;
        Vec_WrdForEachEntry( vSuper, Num, i )
        {
            if ( i + 1 == Vec_WrdSize(vSuper) )
            {
                Vec_WrdWriteEntry( vSuper, k++, Num );
                break;
            }
            NumNext = Vec_WrdEntry( vSuper, i+1 );
            assert( Num <= NumNext );
            if ( Num + 1 == NumNext && (NumNext & 1) ) // pos_lit & neg_lit = 0
            {
                Vec_WrdClear( vSuper );
                return vSuper;
            }
            if ( Num < NumNext )
                Vec_WrdWriteEntry( vSuper, k++, Num );
        }
        Vec_WrdShrink( vSuper, k );
    }
    Vec_WrdForEachEntry( vSuper, Num, i )
        Vec_WrdWriteEntry( vSuper, i, Abc_NtkShareUnpackId(Num) );
    return vSuper;
}